

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::VSliderScalar
               (char *label,ImVec2 *size,ImGuiDataType data_type,void *p_data,void *p_min,
               void *p_max,char *format,float power)

{
  bool bVar1;
  int iVar2;
  ImGuiDataTypeInfo *pIVar3;
  ImGuiDataType in_EDX;
  float _x;
  char *in_stack_00000008;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool hovered;
  ImRect bb;
  ImRect frame_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe38;
  char *p_data_00;
  undefined4 in_stack_fffffffffffffe40;
  ImGuiDataType data_type_00;
  ImGuiID in_stack_fffffffffffffe44;
  ImRect *in_stack_fffffffffffffe48;
  char *buf;
  float in_stack_fffffffffffffe50;
  ImGuiCol in_stack_fffffffffffffe54;
  ImRect *in_stack_fffffffffffffe58;
  undefined1 *puVar4;
  ImGuiWindow *in_stack_fffffffffffffe60;
  ImGuiWindow *in_stack_fffffffffffffe68;
  ImVec2 *pIVar5;
  undefined8 in_stack_fffffffffffffe70;
  float power_00;
  ImVec2 *text_size_if_known;
  ImDrawList *in_stack_fffffffffffffe78;
  undefined1 hide_text_after_hash;
  char *in_stack_fffffffffffffe80;
  ImVec2 *in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe90;
  float fVar6;
  ImRect *bb_00;
  undefined4 in_stack_fffffffffffffea0;
  ImVec2 p_max_00;
  ImVec2 IVar7;
  ImGuiSliderFlags flags;
  ImRect *out_grab_bb;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 *local_120;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  ImRect *in_stack_fffffffffffffef0;
  char local_c8 [4];
  float local_c4;
  ImVec2 aIStack_c0 [3];
  ImU32 local_a4;
  undefined1 local_9d;
  ImRect local_9c;
  ImRect local_8c;
  ImVec2 local_7c;
  undefined1 local_74 [16];
  ImVec2 local_64;
  ImGuiID local_5c;
  ImGuiStyle *local_58;
  ImGuiContext *local_50;
  ImGuiWindow *local_48;
  ImGuiDataType local_1c;
  bool local_1;
  
  power_00 = (float)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_1c = in_EDX;
  local_48 = GetCurrentWindow();
  if ((local_48->SkipItems & 1U) == 0) {
    local_50 = GImGui;
    local_58 = &GImGui->Style;
    p_max_00.x = 0.0;
    p_max_00.y = 0.0;
    local_5c = ImGuiWindow::GetID(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                                  (char *)CONCAT44(in_stack_fffffffffffffe54,
                                                   in_stack_fffffffffffffe50));
    local_64 = CalcTextSize((char *)in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                            SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe58,0));
    IVar7 = (ImVec2)&local_48->DC;
    local_7c = ::operator+(in_stack_fffffffffffffe38,(ImVec2 *)0x20b828);
    ImRect::ImRect((ImRect *)local_74,(ImVec2 *)IVar7,&local_7c);
    pIVar5 = (ImVec2 *)local_74;
    out_grab_bb = (ImRect *)(local_74 + 8);
    if (local_64.x <= 0.0) {
      _x = 0.0;
    }
    else {
      _x = (local_58->ItemInnerSpacing).x + local_64.x;
    }
    bb_00 = &local_9c;
    ImVec2::ImVec2(&bb_00->Min,_x,0.0);
    local_9c.Max = ::operator+(in_stack_fffffffffffffe38,(ImVec2 *)0x20b8d6);
    fVar6 = (float)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    ImRect::ImRect(&local_8c,pIVar5,&local_9c.Max);
    flags = (ImGuiSliderFlags)pIVar5;
    ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),fVar6);
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe68,
                    (ImGuiID)((ulong)in_stack_fffffffffffffe60 >> 0x20),in_stack_fffffffffffffe58);
    if (bVar1) {
      if (in_stack_00000008 == (char *)0x0) {
        pIVar3 = DataTypeGetInfo(local_1c);
        in_stack_00000008 = pIVar3->PrintFmt;
      }
      else if ((local_1c == 4) && (iVar2 = strcmp(in_stack_00000008,"%d"), iVar2 != 0)) {
        in_stack_00000008 = PatchFormatStringFloatToInt((char *)in_stack_fffffffffffffe48);
      }
      local_9d = ItemHoverable(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
      if (((((bool)local_9d) && (((local_50->IO).MouseClicked[0] & 1U) != 0)) ||
          (local_50->NavActivateId == local_5c)) || (local_50->NavInputId == local_5c)) {
        SetActiveID(local_5c,local_48);
        SetFocusID((ImGuiID)power_00,in_stack_fffffffffffffe68);
        FocusWindow((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        local_50->ActiveIdUsingNavDirMask = local_50->ActiveIdUsingNavDirMask | 0xc;
      }
      if (local_50->ActiveId == local_5c) {
        fVar6 = 1.26117e-44;
      }
      else {
        fVar6 = 9.80909e-45;
        if (local_50->HoveredId == local_5c) {
          fVar6 = 1.12104e-44;
        }
      }
      local_a4 = GetColorU32(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
      RenderNavHighlight(in_stack_fffffffffffffef0,(ImGuiID)in_stack_fffffffffffffeec,
                         (ImGuiNavHighlightFlags)in_stack_fffffffffffffee8);
      RenderFrame(IVar7,p_max_00,(ImU32)_x,SUB41((uint)in_stack_fffffffffffffea0 >> 0x18,0),
                  (float)((ulong)bb_00 >> 0x20));
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      buf = local_c8;
      data_type_00 = 1;
      p_data_00 = in_stack_00000008;
      bVar1 = SliderBehavior(bb_00,(ImGuiID)fVar6,(ImGuiDataType)in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                             in_stack_fffffffffffffe78,(char *)IVar7,power_00,flags,out_grab_bb);
      if (bVar1) {
        MarkItemEdited(local_5c);
      }
      if (local_c4 < aIStack_c0[0].y) {
        in_stack_fffffffffffffe78 = local_48->DrawList;
        in_stack_fffffffffffffe80 = local_c8;
        in_stack_fffffffffffffe88 = aIStack_c0;
        GetColorU32(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->Min,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (ImU32)((ulong)buf >> 0x20),SUB84(buf,0),in_stack_fffffffffffffe44);
      }
      puVar4 = &stack0xfffffffffffffee8;
      iVar2 = DataTypeFormatString
                        (buf,in_stack_fffffffffffffe44,data_type_00,p_data_00,(char *)0x20bc80);
      local_120 = (ImVec2 *)(puVar4 + iVar2);
      ImVec2::ImVec2(&local_128,(float)local_74._0_4_,
                     (float)local_74._4_4_ + (local_58->FramePadding).y);
      pIVar5 = (ImVec2 *)&stack0xfffffffffffffee8;
      text_size_if_known = local_120;
      ImVec2::ImVec2(&local_130,0.5,0.0);
      RenderTextClipped((ImVec2 *)CONCAT44(fVar6,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                        (char *)in_stack_fffffffffffffe78,text_size_if_known,pIVar5,
                        (ImRect *)CONCAT44(_x,in_stack_fffffffffffffea0));
      hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
      local_1 = bVar1;
      if (0.0 < local_64.x) {
        ImVec2::ImVec2(&local_138,(float)local_74._8_4_ + (local_58->ItemInnerSpacing).x,
                       (float)local_74._4_4_ + (local_58->FramePadding).y);
        IVar7.y = fVar6;
        IVar7.x = in_stack_fffffffffffffe90;
        RenderText(IVar7,(char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   (bool)hide_text_after_hash);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::VSliderScalar(const char* label, const ImVec2& size, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(frame_bb, id))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    const bool hovered = ItemHoverable(frame_bb, id);
    if ((hovered && g.IO.MouseClicked[0]) || g.NavActivateId == id || g.NavInputId == id)
    {
        SetActiveID(id, window);
        SetFocusID(id, window);
        FocusWindow(window);
        g.ActiveIdUsingNavDirMask |= (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, p_data, p_min, p_max, format, power, ImGuiSliderFlags_Vertical, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.y > grab_bb.Min.y)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    // For the vertical slider we allow centered text to overlap the frame padding
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f,0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    return value_changed;
}